

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O3

uint16_t bssl::ssl_protocol_version(SSL *ssl)

{
  uint16_t version_00;
  bool bVar1;
  undefined8 in_RAX;
  uint16_t version;
  uint16_t local_2;
  
  local_2 = (uint16_t)((ulong)in_RAX >> 0x30);
  version_00 = ssl->s3->version;
  if (version_00 == 0) {
    __assert_fail("ssl->s3->version != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                  ,0x113,"uint16_t bssl::ssl_protocol_version(const SSL *)");
  }
  bVar1 = ssl_protocol_version_from_wire(&local_2,version_00);
  if (bVar1) {
    return local_2;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                ,0x117,"uint16_t bssl::ssl_protocol_version(const SSL *)");
}

Assistant:

uint16_t ssl_protocol_version(const SSL *ssl) {
  assert(ssl->s3->version != 0);
  uint16_t version;
  if (!ssl_protocol_version_from_wire(&version, ssl->s3->version)) {
    // |ssl->s3->version| will always be set to a valid version.
    assert(0);
    return 0;
  }

  return version;
}